

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Aig_Obj_t * Saig_BmcIntervalToAig_rec(Saig_Bmc_t *p,Aig_Man_t *pNew,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  uint uVar5;
  Aig_Obj_t *p1;
  
  if ((Aig_Obj_t *)(pObj->field_5).pData != (Aig_Obj_t *)0x0) {
    return (Aig_Obj_t *)(pObj->field_5).pData;
  }
  Vec_IntPush(p->vVisited,pObj->Id);
  iVar1 = Saig_BmcSatNum(p,pObj);
  uVar5 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
  if (iVar1 == 0) {
    uVar2 = 0;
    if (uVar5 != 2) {
      Saig_BmcIntervalToAig_rec(p,pNew,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Saig_BmcIntervalToAig_rec(p,pNew,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      if ((pObj->field_5).pData != (void *)0x0) {
        __assert_fail("pObj->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                      ,0x1fc,
                      "Aig_Obj_t *Saig_BmcIntervalToAig_rec(Saig_Bmc_t *, Aig_Man_t *, Aig_Obj_t *)"
                     );
      }
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      uVar4 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      pAVar3 = Aig_And(pNew,pAVar3,p1);
      goto LAB_0042e7e1;
    }
  }
  else {
    uVar2 = (uint)(uVar5 != 2);
  }
  p->nStitchVars = p->nStitchVars + uVar2;
  pAVar3 = Aig_ObjCreateCi(pNew);
LAB_0042e7e1:
  (pObj->field_5).pData = pAVar3;
  return pAVar3;
}

Assistant:

Aig_Obj_t * Saig_BmcIntervalToAig_rec( Saig_Bmc_t * p, Aig_Man_t * pNew, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    Vec_IntPush( p->vVisited, Aig_ObjId(pObj) );
    if ( Saig_BmcSatNum(p, pObj) || Aig_ObjIsCi(pObj) )
    {
        p->nStitchVars += !Aig_ObjIsCi(pObj);
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjCreateCi(pNew));
    }
    Saig_BmcIntervalToAig_rec( p, pNew, Aig_ObjFanin0(pObj) );
    Saig_BmcIntervalToAig_rec( p, pNew, Aig_ObjFanin1(pObj) );
    assert( pObj->pData == NULL );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ));
}